

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

size_t __thiscall
notch::io::PlainTextNetworkReader::read_header
          (PlainTextNetworkReader *this,istream *in,MakeNet *mknet)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  runtime_error *prVar3;
  float fmtVersion;
  size_t nLayers;
  size_t inputDim;
  string netTag;
  size_t outputDim;
  string local_90;
  float local_6c;
  size_t local_68;
  size_t local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  unsigned_long local_38;
  
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"net:","");
  read_tag_value<std::__cxx11::string>(this,in,&local_90,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar2 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_90,"unsupported network type: ",&local_58);
    std::runtime_error::runtime_error(prVar3,(string *)&local_90);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"format:","");
  read_tag_value<float>(this,in,&local_90,&local_6c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((local_6c == 1.0) && (!NAN(local_6c))) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"inputs:","");
    read_tag_value<unsigned_long>(this,in,&local_90,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"outputs:","");
    read_tag_value<unsigned_long>(this,in,&local_90,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"layers:","");
    read_tag_value<unsigned_long>(this,in,&local_90,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    consume_end_of_record(this,in);
    core::MakeNet::setInputDim(mknet,local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    return local_68;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"unsupported version network format");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t read_header(std::istream &in, MakeNet &mknet) {
        std::string netTag;
        float fmtVersion;
        size_t inputDim;
        size_t outputDim;
        size_t nLayers;
        read_tag_value<std::string>(in, "net:", netTag);
        if (netTag != "Net") {
            throw std::runtime_error("unsupported network type: " + netTag);
        }
        read_tag_value<float>(in, "format:", fmtVersion);
        if (fmtVersion != 1.0) {
            throw std::runtime_error("unsupported version network format");
        }
        read_tag_value<size_t>(in, "inputs:", inputDim);
        read_tag_value<size_t>(in, "outputs:", outputDim); // ignore
        read_tag_value<size_t>(in, "layers:", nLayers);
        consume_end_of_record(in);
        mknet.setInputDim(inputDim);
        return nLayers;
    }